

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

void __thiscall script_tests::sign_invalid_miniscript::test_method(sign_invalid_miniscript *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  iterator pvVar4;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  Span<const_unsigned_char> script;
  CMutableTransaction curr;
  CMutableTransaction prev;
  TaprootBuilder builder;
  array<unsigned_char,_60UL> invalid_pubkey;
  FillableSigningProvider keystore;
  check_type cVar6;
  char *local_678;
  char *local_670;
  undefined8 local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  CMutableTransaction local_638;
  undefined1 local_600 [56];
  undefined1 local_5c8 [64];
  _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  local_588;
  undefined1 local_540 [8];
  element_type *peStack_538;
  shared_count local_530;
  uchar auStack_528 [8];
  undefined1 local_520 [24];
  undefined8 uStack_508;
  TaprootBuilder local_500;
  uchar local_498 [64];
  undefined1 local_458 [136];
  uchar auStack_3d0 [8];
  uchar local_3c8 [8];
  uchar auStack_3c0 [8];
  uchar local_3b8 [8];
  uchar auStack_3b0 [8];
  uchar local_3a8 [8];
  uchar auStack_3a0 [8];
  _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  local_398 [3];
  bool local_300;
  _Rb_tree_node_base local_2f0;
  size_t local_2d0;
  _Rb_tree_node_base local_2c0;
  size_t local_2a0;
  pointer puStack_298;
  pointer local_290;
  pointer puStack_288;
  _Rb_tree_node_base local_278;
  size_t local_258;
  _Rb_tree_node_base local_248;
  size_t local_228;
  _Rb_tree_node_base local_218;
  size_t local_1f8;
  pointer pCStack_1f0;
  pointer local_1e8;
  pointer pCStack_1e0;
  pointer local_1d8;
  pointer pCStack_1d0;
  pointer local_1c8;
  uchar auStack_1c0 [64];
  _Rb_tree_node_base local_180;
  size_t local_160;
  _Rb_tree_node_base local_150;
  size_t local_130;
  _Rb_tree_node_base local_120;
  size_t local_100;
  _Rb_tree_node_base local_f0;
  size_t local_d0;
  SigningProvider local_c8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_c0;
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  local_90;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c8._vptr_SigningProvider = (_func_int **)&PTR__FillableSigningProvider_013bee20;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58 = 0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_60 = 0;
  local_48 = 0;
  uStack_40 = 0;
  uStack_50 = 1;
  local_458[0] = false;
  local_458[1] = false;
  p_Var1 = &local_398[0]._M_impl.super__Rb_tree_header;
  local_398[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  memset(local_458 + 8,0,0xb8);
  local_398[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_300 = false;
  local_2f0._M_left = &local_2f0;
  local_2f0._M_color = _S_red;
  local_2f0._M_parent = (_Base_ptr)0x0;
  local_2d0 = 0;
  local_2c0._M_left = &local_2c0;
  local_2c0._M_color = _S_red;
  local_2c0._M_parent = (_Base_ptr)0x0;
  local_278._M_left = &local_278;
  local_278._M_color = _S_red;
  local_278._M_parent = (_Base_ptr)0x0;
  local_2a0 = 0;
  puStack_298 = (pointer)0x0;
  local_290 = (pointer)0x0;
  puStack_288 = (pointer)0x0;
  local_258 = 0;
  local_248._M_left = &local_248;
  local_248._M_color = _S_red;
  local_248._M_parent = (_Base_ptr)0x0;
  local_228 = 0;
  local_218._M_left = &local_218;
  local_218._M_color = _S_red;
  local_218._M_parent = (_Base_ptr)0x0;
  local_180._M_left = &local_180;
  local_180._M_color = _S_red;
  local_180._M_parent = (_Base_ptr)0x0;
  auStack_1c0[0x28] = '\0';
  auStack_1c0[0x29] = '\0';
  auStack_1c0[0x2a] = '\0';
  auStack_1c0[0x2b] = '\0';
  auStack_1c0[0x2c] = '\0';
  auStack_1c0[0x2d] = '\0';
  auStack_1c0[0x2e] = '\0';
  auStack_1c0[0x2f] = '\0';
  auStack_1c0[0x30] = '\0';
  auStack_1c0[0x31] = '\0';
  auStack_1c0[0x32] = '\0';
  auStack_1c0[0x33] = '\0';
  auStack_1c0[0x18] = '\0';
  auStack_1c0[0x19] = '\0';
  auStack_1c0[0x1a] = '\0';
  auStack_1c0[0x1b] = '\0';
  auStack_1c0[0x1c] = '\0';
  auStack_1c0[0x1d] = '\0';
  auStack_1c0[0x1e] = '\0';
  auStack_1c0[0x1f] = '\0';
  auStack_1c0[0x20] = '\0';
  auStack_1c0[0x21] = '\0';
  auStack_1c0[0x22] = '\0';
  auStack_1c0[0x23] = '\0';
  auStack_1c0[0x24] = '\0';
  auStack_1c0[0x25] = '\0';
  auStack_1c0[0x26] = '\0';
  auStack_1c0[0x27] = '\0';
  auStack_1c0[8] = '\0';
  auStack_1c0[9] = '\0';
  auStack_1c0[10] = '\0';
  auStack_1c0[0xb] = '\0';
  auStack_1c0[0xc] = '\0';
  auStack_1c0[0xd] = '\0';
  auStack_1c0[0xe] = '\0';
  auStack_1c0[0xf] = '\0';
  auStack_1c0[0x10] = '\0';
  auStack_1c0[0x11] = '\0';
  auStack_1c0[0x12] = '\0';
  auStack_1c0[0x13] = '\0';
  auStack_1c0[0x14] = '\0';
  auStack_1c0[0x15] = '\0';
  auStack_1c0[0x16] = '\0';
  auStack_1c0[0x17] = '\0';
  local_1c8 = (pointer)0x0;
  auStack_1c0[0] = '\0';
  auStack_1c0[1] = '\0';
  auStack_1c0[2] = '\0';
  auStack_1c0[3] = '\0';
  auStack_1c0[4] = '\0';
  auStack_1c0[5] = '\0';
  auStack_1c0[6] = '\0';
  auStack_1c0[7] = '\0';
  local_1d8 = (pointer)0x0;
  pCStack_1d0 = (pointer)0x0;
  local_1e8 = (pointer)0x0;
  pCStack_1e0 = (pointer)0x0;
  local_1f8 = 0;
  pCStack_1f0 = (pointer)0x0;
  local_160 = 0;
  local_150._M_left = &local_150;
  local_150._M_color = _S_red;
  local_150._M_parent = (_Base_ptr)0x0;
  local_130 = 0;
  local_120._M_left = &local_120;
  local_120._M_color = _S_red;
  local_120._M_parent = (_Base_ptr)0x0;
  local_100 = 0;
  local_f0._M_left = &local_f0;
  local_f0._M_color = _S_red;
  local_f0._M_parent = (_Base_ptr)0x0;
  local_d0 = 0;
  local_398[0]._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_398[0]._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_2f0._M_right = local_2f0._M_left;
  local_2c0._M_right = local_2c0._M_left;
  local_278._M_right = local_278._M_left;
  local_248._M_right = local_248._M_left;
  local_218._M_right = local_218._M_left;
  local_180._M_right = local_180._M_left;
  local_150._M_right = local_150._M_left;
  local_120._M_right = local_120._M_left;
  local_f0._M_right = local_f0._M_left;
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_600);
  CMutableTransaction::CMutableTransaction(&local_638);
  local_498[0x30] = 0x92;
  local_498[0x31] = 0x92;
  local_498[0x32] = 0x92;
  local_498[0x33] = 0x92;
  local_498[0x34] = 0x92;
  local_498[0x35] = 'k';
  local_498[0x36] = '\0';
  local_498[0x37] = 'l';
  local_498[0x38] = 0x9b;
  local_498[0x39] = 0x9b;
  local_498[0x3a] = 0x92;
  local_498[0x3b] = 0x92;
  builtin_memcpy(local_498 + 0x20,"\x1e\x1e\x1e\x1e\x19",6);
  local_498[0x26] = '\0';
  local_498[0x27] = '\0';
  local_498[0x28] = '\0';
  local_498[0x29] = '\0';
  local_498[0x2a] = '\0';
  local_498[0x2b] = '\0';
  local_498[0x2c] = '\0';
  local_498[0x2d] = '\0';
  local_498[0x2e] = 0xb1;
  local_498[0x2f] = 0x92;
  local_498[0x10] = '\0';
  local_498[0x11] = '\0';
  local_498[0x12] = '\x02';
  local_498[0x13] = '\x1e';
  local_498[0x14] = '\x1e';
  local_498[0x15] = '7';
  local_498[0x16] = '7';
  local_498[0x17] = '7';
  local_498[0x18] = '!';
  local_498[0x19] = '6';
  local_498[0x1a] = '\x18';
  local_498[0x1b] = '\x18';
  local_498[0x1c] = '\x18';
  local_498[0x1d] = '\x18';
  local_498[0x1e] = '\x18';
  local_498[0x1f] = '\x18';
  local_498[0] = '\x17';
  local_498[1] = '=';
  local_498[2] = '6';
  local_498[3] = 200;
  local_498[4] = 0xc9;
  local_498[5] = 0xc9;
  local_498[6] = 0xc9;
  local_498[7] = 0xff;
  local_498[8] = 0xff;
  local_498[9] = 0xff;
  local_498[10] = 0xff;
  local_498[0xb] = 0xff;
  local_498[0xc] = 0xff;
  local_498[0xd] = '\x02';
  local_498[0xe] = '\0';
  local_498[0xf] = '\0';
  local_500.m_valid = true;
  local_500.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_500.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_500.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_500.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_500.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  pvVar4 = &DAT_000000c0;
  pvVar5 = (iterator)0x1;
  script.m_size = 0x3c;
  script.m_data = local_498;
  TaprootBuilder::Add(&local_500,0,script,0xc0,true);
  TaprootBuilder::Finalize(&local_500,&XOnlyPubKey::NUMS_H);
  local_668 = (char *)((ulong)local_668._4_4_ << 0x20);
  TaprootBuilder::GetOutput((WitnessV1Taproot *)local_540,&local_500);
  local_5c8._16_8_ = local_530.pi_;
  local_5c8[0x18] = auStack_528[0];
  local_5c8[0x19] = auStack_528[1];
  local_5c8[0x1a] = auStack_528[2];
  local_5c8[0x1b] = auStack_528[3];
  local_5c8[0x1c] = auStack_528[4];
  local_5c8[0x1d] = auStack_528[5];
  local_5c8[0x1e] = auStack_528[6];
  local_5c8[0x1f] = auStack_528[7];
  local_5c8._8_8_ = peStack_538;
  local_588._M_impl.super__Rb_tree_header._M_header._M_color =
       CONCAT31(local_588._M_impl.super__Rb_tree_header._M_header._M_color._1_3_,'\x06');
  GetScriptForDestination((CScript *)local_520,(CTxDestination *)local_5c8);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)(local_600 + 0x18),(int *)&local_668,
             (CScript *)local_520);
  if (0x1c < uStack_508._4_4_) {
    free((void *)local_520._0_8_);
    local_520._0_8_ = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_5c8);
  CMutableTransaction::GetHash((Txid *)local_520,(CMutableTransaction *)local_600);
  local_5c8._8_8_ = CONCAT71(local_520._9_7_,local_520[8]);
  local_5c8._16_8_ = local_520._16_8_;
  local_5c8._24_8_ = uStack_508;
  local_5c8._0_8_ = local_520._0_8_;
  local_5c8._32_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&local_638.vin,(COutPoint *)local_5c8);
  TaprootBuilder::GetSpendData((TaprootSpendData *)local_5c8,&local_500);
  local_3b8._4_4_ = local_5c8._36_4_;
  local_3b8._0_4_ = local_5c8._32_4_;
  local_3c8[0] = local_5c8[0x10];
  local_3c8[1] = local_5c8[0x11];
  local_3c8[2] = local_5c8[0x12];
  local_3c8[3] = local_5c8[0x13];
  local_3c8[4] = local_5c8[0x14];
  local_3c8[5] = local_5c8[0x15];
  local_3c8[6] = local_5c8[0x16];
  local_3c8[7] = local_5c8[0x17];
  auStack_3c0[0] = local_5c8[0x18];
  auStack_3c0[1] = local_5c8[0x19];
  auStack_3c0[2] = local_5c8[0x1a];
  auStack_3c0[3] = local_5c8[0x1b];
  auStack_3c0[4] = local_5c8[0x1c];
  auStack_3c0[5] = local_5c8[0x1d];
  auStack_3c0[6] = local_5c8[0x1e];
  auStack_3c0[7] = local_5c8[0x1f];
  local_458._128_8_ = local_5c8._0_8_;
  auStack_3d0[0] = local_5c8[8];
  auStack_3d0[1] = local_5c8[9];
  auStack_3d0[2] = local_5c8[10];
  auStack_3d0[3] = local_5c8[0xb];
  auStack_3d0[4] = local_5c8[0xc];
  auStack_3d0[5] = local_5c8[0xd];
  auStack_3d0[6] = local_5c8[0xe];
  auStack_3d0[7] = local_5c8[0xf];
  auStack_3b0[0] = local_5c8[0x28];
  auStack_3b0[1] = local_5c8[0x29];
  auStack_3b0[2] = local_5c8[0x2a];
  auStack_3b0[3] = local_5c8[0x2b];
  auStack_3b0[4] = local_5c8[0x2c];
  auStack_3b0[5] = local_5c8[0x2d];
  auStack_3b0[6] = local_5c8[0x2e];
  auStack_3b0[7] = local_5c8[0x2f];
  local_3a8[0] = local_5c8[0x30];
  local_3a8[1] = local_5c8[0x31];
  local_3a8[2] = local_5c8[0x32];
  local_3a8[3] = local_5c8[0x33];
  local_3a8[4] = local_5c8[0x34];
  local_3a8[5] = local_5c8[0x35];
  local_3a8[6] = local_5c8[0x36];
  local_3a8[7] = local_5c8[0x37];
  auStack_3a0[0] = local_5c8[0x38];
  auStack_3a0[1] = local_5c8[0x39];
  auStack_3a0[2] = local_5c8[0x3a];
  auStack_3a0[3] = local_5c8[0x3b];
  auStack_3a0[4] = local_5c8[0x3c];
  auStack_3a0[5] = local_5c8[0x3d];
  auStack_3a0[6] = local_5c8[0x3e];
  auStack_3a0[7] = local_5c8[0x3f];
  std::
  _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  ::clear(local_398);
  if (local_588._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_588._M_impl.super__Rb_tree_header;
    local_398[0]._M_impl.super__Rb_tree_header._M_header._M_color =
         local_588._M_impl.super__Rb_tree_header._M_header._M_color;
    local_398[0]._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_588._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_398[0]._M_impl.super__Rb_tree_header._M_header._M_left =
         local_588._M_impl.super__Rb_tree_header._M_header._M_left;
    local_398[0]._M_impl.super__Rb_tree_header._M_header._M_right =
         local_588._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_588._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    local_398[0]._M_impl.super__Rb_tree_header._M_node_count =
         local_588._M_impl.super__Rb_tree_header._M_node_count;
    local_588._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_588._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_588._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_588._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_588);
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x501;
  file.m_begin = (iterator)&local_648;
  msg.m_end = pvVar5;
  msg.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_658,msg);
  CTransaction::CTransaction((CTransaction *)local_5c8,(CMutableTransaction *)local_600);
  bVar3 = SignSignature(&local_c8,(CTransaction *)local_5c8,&local_638,0,1,
                        (SignatureData *)local_458);
  local_540[0] = (class_property<bool>)!bVar3;
  peStack_538 = (element_type *)0x0;
  local_530.pi_ = (sp_counted_base *)0x0;
  local_668 = "!SignSignature(keystore, CTransaction(prev), curr, 0, SIGHASH_ALL, sig_data)";
  local_660 = "";
  local_520[8] = '\0';
  local_520._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_520._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_670 = "";
  uStack_508 = (int *)&local_668;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_540,(lazy_ostream *)local_520,1,0,WARN,_cVar6,
             (size_t)&local_678,0x501);
  boost::detail::shared_count::~shared_count(&local_530);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_5c8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_5c8);
  std::
  vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ::~vector(&local_500.m_branch);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_638.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_638.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_600 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_600);
  SignatureData::~SignatureData((SignatureData *)local_458);
  local_c8._vptr_SigningProvider = (_func_int **)&PTR__FillableSigningProvider_013bee20;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_invalid_miniscript)
{
    FillableSigningProvider keystore;
    SignatureData sig_data;
    CMutableTransaction prev, curr;

    // Create a Taproot output which contains a leaf in which a non-32 bytes push is used where a public key is expected
    // by the Miniscript parser. This offending Script was found by the RPC fuzzer.
    const auto invalid_pubkey{"173d36c8c9c9c9ffffffffffff0200000000021e1e37373721361818181818181e1e1e1e19000000000000000000b19292929292926b006c9b9b9292"_hex_u8};
    TaprootBuilder builder;
    builder.Add(0, {invalid_pubkey}, 0xc0);
    builder.Finalize(XOnlyPubKey::NUMS_H);
    prev.vout.emplace_back(0, GetScriptForDestination(builder.GetOutput()));
    curr.vin.emplace_back(COutPoint{prev.GetHash(), 0});
    sig_data.tr_spenddata = builder.GetSpendData();

    // SignSignature can fail but it shouldn't raise an exception (nor crash).
    BOOST_CHECK(!SignSignature(keystore, CTransaction(prev), curr, 0, SIGHASH_ALL, sig_data));
}